

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_13::Poppifier::patchScope(Poppifier *this,Expression **expr)

{
  reference pvVar1;
  Block *pBVar2;
  size_type sVar3;
  reference ppEVar4;
  Block *block;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *instrs;
  type scope;
  Expression **expr_local;
  Poppifier *this_local;
  
  scope.instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = expr;
  pvVar1 = std::
           vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
           ::back(&this->scopeStack);
  Scope::Scope((Scope *)&instrs,pvVar1);
  std::
  vector<wasm::(anonymous_namespace)::Poppifier::Scope,_std::allocator<wasm::(anonymous_namespace)::Poppifier::Scope>_>
  ::pop_back(&this->scopeStack);
  pBVar2 = Expression::dynCast<wasm::Block>
                     (*scope.instrs.
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (pBVar2 == (Block *)0x0) {
    pBVar2 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (&this->builder,
                        (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&scope,
                        (Type)((*scope.instrs.
                                 super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->type).id);
    *scope.instrs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
     _M_impl.super__Vector_impl_data._M_end_of_storage = (Expression *)pBVar2;
  }
  else {
    sVar3 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size
                      ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&scope);
    if ((sVar3 == 0) ||
       (ppEVar4 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::operator[]
                            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &scope,0), (Block *)*ppEVar4 != pBVar2)) {
      ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
      set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pBVar2->list,
                 (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&scope);
    }
  }
  Scope::~Scope((Scope *)&instrs);
  return;
}

Assistant:

void Poppifier::patchScope(Expression*& expr) {
  auto scope = std::move(scopeStack.back());
  auto& instrs = scope.instrs;
  scopeStack.pop_back();
  if (auto* block = expr->dynCast<Block>()) {
    // Reuse blocks, but do not patch a block into itself, which would otherwise
    // happen when emitting if/else or try/catch arms and function bodies.
    if (instrs.size() == 0 || instrs[0] != block) {
      block->list.set(instrs);
    }
  } else {
    // Otherwise create a new block, even if we have just a single
    // expression. We want blocks in every new scope rather than other
    // instructions because Poppy IR optimizations only look at the children of
    // blocks.
    expr = builder.makeBlock(instrs, expr->type);
  }
}